

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVMValidator.cpp
# Opt level: O2

Result * CoreML::validate<(MLModelType)301>(Result *__return_storage_ptr__,Model *format)

{
  bool bVar1;
  SupportVectorRegressor *this;
  DenseSupportVectors *pDVar2;
  Coefficients *pCVar3;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *features;
  Kernel *kernel;
  ModelDescription *description;
  allocator local_71;
  undefined1 local_70 [40];
  Result result;
  
  Result::Result(&result);
  description = format->description_;
  if (description == (ModelDescription *)0x0) {
    description = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  validateDescriptionsAreAllVectorizableTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
            ((Result *)local_70,(CoreML *)&description->input_,features);
  Result::operator=(&result,(Result *)local_70);
  std::__cxx11::string::~string((string *)(local_70 + 8));
  bVar1 = Result::good(&result);
  if (bVar1) {
    validateRegressorInterface((Result *)local_70,description,format->specificationversion_);
    Result::operator=(&result,(Result *)local_70);
    std::__cxx11::string::~string((string *)(local_70 + 8));
    bVar1 = Result::good(&result);
    if (bVar1) {
      this = Specification::Model::supportvectorregressor(format);
      kernel = this->kernel_;
      if (kernel == (Kernel *)0x0) {
        kernel = (Kernel *)&Specification::_Kernel_default_instance_;
      }
      validateKernel((Result *)local_70,kernel);
      Result::operator=(&result,(Result *)local_70);
      std::__cxx11::string::~string((string *)(local_70 + 8));
      bVar1 = Result::good(&result);
      if (bVar1) {
        if (this->_oneof_case_[0] == 2) {
          pDVar2 = (DenseSupportVectors *)
                   Specification::SupportVectorRegressor::sparsesupportvectors(this);
LAB_0022a394:
          pCVar3 = this->coefficients_;
          if (pCVar3 == (Coefficients *)0x0) {
            pCVar3 = (Coefficients *)&Specification::_Coefficients_default_instance_;
          }
          if ((pCVar3->alpha_).current_size_ ==
              (pDVar2->vectors_).super_RepeatedPtrFieldBase.current_size_) goto LAB_0022a3ac;
          std::__cxx11::string::string
                    ((string *)local_70,
                     "The number of coefficients must match the number of support vectors.",
                     &local_71);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_70);
        }
        else {
          if (this->_oneof_case_[0] == 3) {
            pDVar2 = Specification::SupportVectorRegressor::densesupportvectors(this);
            goto LAB_0022a394;
          }
          std::__cxx11::string::string
                    ((string *)local_70,"Must specify sparse or dense support vectors",&local_71);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_70);
        }
        std::__cxx11::string::~string((string *)local_70);
        goto LAB_0022a3b9;
      }
    }
  }
LAB_0022a3ac:
  Result::Result(__return_storage_ptr__,&result);
LAB_0022a3b9:
  std::__cxx11::string::~string((string *)&result.m_message);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_supportVectorRegressor>(const Specification::Model& format) {

        Result result;
        const Specification::ModelDescription& description = format.description();

        // Check that inputs are vectorizable
        result = validateDescriptionsAreAllVectorizableTypes(description.input());
        if (!result.good()) {
            return result;
        }

        // Must have a regressor interface (since GLMRegressor is an MLRegressor)
        result = validateRegressorInterface(description, format.specificationversion());
        if (!result.good()) {
            return result;
        }

        const Specification::SupportVectorRegressor& svmSpec = format.supportvectorregressor();

        result = validateKernel(svmSpec.kernel());
        if (!result.good()) {
            return result;
        }

        // Coefficient size must match the size of all support vectors
        int totalSVs = 0;
        switch (svmSpec.supportVectors_case()) {
            case Specification::SupportVectorRegressor::kSparseSupportVectors:
                totalSVs = svmSpec.sparsesupportvectors().vectors_size();
                break;
            case Specification::SupportVectorRegressor::kDenseSupportVectors:
                totalSVs = svmSpec.densesupportvectors().vectors_size();
                break;
            default:
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "Must specify sparse or dense support vectors");
        }

        if(svmSpec.coefficients().alpha_size() != totalSVs) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "The number of coefficients must match the number of support vectors.");
        }

        return result;

    }